

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int js_relational_slow(JSContext *ctx,JSValue *sp,OPCodeEnum op)

{
  JSValue *pJVar1;
  int *piVar2;
  int64_t iVar3;
  JSValue val;
  uint uVar4;
  int iVar5;
  JSValueUnion JVar6;
  JSValueUnion p1;
  JSRefCountHeader *p;
  JSRuntime *rt;
  uint uVar7;
  JSRefCountHeader *p_3;
  bool bVar8;
  JSValue val_00;
  JSValue val_01;
  double d2;
  double d1;
  JSValueUnion local_40;
  JSValueUnion local_38;
  
  pJVar1 = sp + -1;
  piVar2 = (int *)(pJVar1->u).ptr;
  iVar3 = sp[-1].tag;
  val_01 = *pJVar1;
  val = *pJVar1;
  val_00 = JS_ToPrimitiveFree(ctx,sp[-2],1);
  JVar6 = val_00.u;
  uVar4 = (uint)val_00.tag;
  if ((val_00.tag & 0xffffffffU) == 6) {
    if (((uint)iVar3 < 0xfffffff5) || (iVar5 = *piVar2, *piVar2 = iVar5 + -1, 1 < iVar5))
    goto LAB_00138bac;
    rt = ctx->rt;
  }
  else {
    val_01 = JS_ToPrimitiveFree(ctx,val,1);
    p1 = val_01.u;
    uVar7 = (uint)val_01.tag;
    if ((val_01.tag & 0xffffffffU) != 6) {
      if ((uVar4 == 0xfffffff9) && (uVar7 == 0xfffffff9)) {
        uVar4 = js_string_compare((JSContext *)JVar6.ptr,(JSString *)p1.ptr,(JSString *)JVar6);
        iVar5 = *JVar6.ptr;
        *(int *)JVar6.ptr = iVar5 + -1;
        if (iVar5 < 2) {
          __JS_FreeValueRT(ctx->rt,val_00);
        }
        iVar5 = *p1.ptr;
        *(int *)p1.ptr = iVar5 + -1;
        if (iVar5 < 2) {
          __JS_FreeValueRT(ctx->rt,val_01);
        }
        if (op == OP_gt) {
          JVar6._1_7_ = 0;
          JVar6.int32._0_1_ = 0 < (int)uVar4;
        }
        else if (op == OP_lte) {
          JVar6._1_7_ = 0;
          JVar6.int32._0_1_ = (int)uVar4 < 1;
        }
        else if (op == OP_lt) {
          JVar6._0_4_ = uVar4 >> 0x1f;
          JVar6._4_4_ = 0;
        }
        else {
          JVar6._1_7_ = 0;
          JVar6.int32._0_1_ = -1 < (int)uVar4;
        }
        goto LAB_00138d53;
      }
      if (uVar4 < 3) {
        JVar6.float64 = (double)val_00.u._0_4_;
      }
      else if ((uVar4 != 7) &&
              (iVar5 = __JS_ToFloat64Free(ctx,&local_38.float64,val_00), JVar6 = local_38,
              iVar5 != 0)) {
        if ((uVar7 < 0xfffffff5) || (iVar5 = *p1.ptr, *(int *)p1.ptr = iVar5 + -1, 1 < iVar5))
        goto LAB_00138bac;
        rt = ctx->rt;
        goto LAB_00138ba7;
      }
      local_38 = JVar6;
      if (uVar7 < 3) {
        p1.float64 = (double)val_01.u._0_4_;
      }
      else if ((uVar7 != 7) &&
              (iVar5 = __JS_ToFloat64Free(ctx,&local_40.float64,val_01), p1 = local_40, iVar5 != 0))
      goto LAB_00138bac;
      local_40 = p1;
      if (op == OP_gt) {
        bVar8 = local_38.float64 < local_40.float64;
LAB_00138d45:
        JVar6._1_7_ = 0;
        JVar6.int32._0_1_ = !bVar8 && local_40.float64 != local_38.float64;
      }
      else {
        if (op == OP_lte) {
          bVar8 = local_40.float64 < local_38.float64;
        }
        else {
          if (op == OP_lt) {
            bVar8 = local_40.float64 < local_38.float64;
            goto LAB_00138d45;
          }
          bVar8 = local_38.float64 < local_40.float64;
        }
        JVar6._1_7_ = 0;
        JVar6.int32._0_1_ = !bVar8;
      }
LAB_00138d53:
      sp[-2].u = JVar6;
      sp[-2].tag = 1;
      return 0;
    }
    if ((uVar4 < 0xfffffff5) || (iVar5 = *JVar6.ptr, *(int *)JVar6.ptr = iVar5 + -1, 1 < iVar5))
    goto LAB_00138bac;
    rt = ctx->rt;
    val_01 = val_00;
  }
LAB_00138ba7:
  __JS_FreeValueRT(rt,val_01);
LAB_00138bac:
  sp[-2].u.int32 = 0;
  sp[-2].tag = 3;
  sp[-1].u.int32 = 0;
  sp[-1].tag = 3;
  return -1;
}

Assistant:

static no_inline int js_relational_slow(JSContext *ctx, JSValue *sp,
                                        OPCodeEnum op)
{
    JSValue op1, op2;
    int res;

    op1 = sp[-2];
    op2 = sp[-1];
    op1 = JS_ToPrimitiveFree(ctx, op1, HINT_NUMBER);
    if (JS_IsException(op1)) {
        JS_FreeValue(ctx, op2);
        goto exception;
    }
    op2 = JS_ToPrimitiveFree(ctx, op2, HINT_NUMBER);
    if (JS_IsException(op2)) {
        JS_FreeValue(ctx, op1);
        goto exception;
    }
    if (JS_VALUE_GET_TAG(op1) == JS_TAG_STRING &&
        JS_VALUE_GET_TAG(op2) == JS_TAG_STRING) {
        JSString *p1, *p2;
        p1 = JS_VALUE_GET_STRING(op1);
        p2 = JS_VALUE_GET_STRING(op2);
        res = js_string_compare(ctx, p1, p2);
        JS_FreeValue(ctx, op1);
        JS_FreeValue(ctx, op2);
        switch(op) {
        case OP_lt:
            res = (res < 0);
            break;
        case OP_lte:
            res = (res <= 0);
            break;
        case OP_gt:
            res = (res > 0);
            break;
        default:
        case OP_gte:
            res = (res >= 0);
            break;
        }
    } else {
        double d1, d2;
        if (JS_ToFloat64Free(ctx, &d1, op1)) {
            JS_FreeValue(ctx, op2);
            goto exception;
        }
        if (JS_ToFloat64Free(ctx, &d2, op2))
            goto exception;
        switch(op) {
        case OP_lt:
            res = (d1 < d2); /* if NaN return false */
            break;
        case OP_lte:
            res = (d1 <= d2); /* if NaN return false */
            break;
        case OP_gt:
            res = (d1 > d2); /* if NaN return false */
            break;
        default:
        case OP_gte:
            res = (d1 >= d2); /* if NaN return false */
            break;
        }
    }
    sp[-2] = JS_NewBool(ctx, res);
    return 0;
 exception:
    sp[-2] = JS_UNDEFINED;
    sp[-1] = JS_UNDEFINED;
    return -1;
}